

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

ReduceLogSumExpLayerParams * __thiscall
CoreML::Specification::ReduceLogSumExpLayerParams::New
          (ReduceLogSumExpLayerParams *this,Arena *arena)

{
  ReduceLogSumExpLayerParams *this_00;
  ReduceLogSumExpLayerParams *n;
  Arena *arena_local;
  ReduceLogSumExpLayerParams *this_local;
  
  this_00 = (ReduceLogSumExpLayerParams *)operator_new(0x30);
  ReduceLogSumExpLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReduceLogSumExpLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReduceLogSumExpLayerParams* ReduceLogSumExpLayerParams::New(::google::protobuf::Arena* arena) const {
  ReduceLogSumExpLayerParams* n = new ReduceLogSumExpLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}